

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O0

void do_bidi(BidiContext *ctx,bidi_char *text,size_t textlen)

{
  size_t textlen_local;
  bidi_char *text_local;
  BidiContext *ctx_local;
  
  ctx->paragraphOverride = ON;
  do_bidi_new(ctx,text,textlen);
  return;
}

Assistant:

void do_bidi(BidiContext *ctx, bidi_char *text, size_t textlen)
{
#ifdef REMOVE_FORMATTING_CHARACTERS
    abort(); /* can't use the standard algorithm in a live terminal */
#else
    ctx->paragraphOverride = ON;
    do_bidi_new(ctx, text, textlen);
#endif
}